

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

void __thiscall duckdb::ReservoirSamplePercentage::Finalize(ReservoirSamplePercentage *this)

{
  idx_t iVar1;
  Allocator *allocator;
  bool bVar2;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var3;
  uint32_t uVar4;
  pointer this_00;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var5;
  pointer pRVar6;
  pointer pDVar7;
  type pDVar8;
  undefined1 auVar9 [16];
  double dVar10;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  templated_unique_single_t new_sample;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_40;
  _Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
  local_38;
  
  iVar1 = this->current_count;
  auVar9._8_4_ = (int)(iVar1 >> 0x20);
  auVar9._0_8_ = iVar1;
  auVar9._12_4_ = 0x45300000;
  dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
  if ((iVar1 == 0) ||
     (dVar10 <= this->sample_percentage * 100000.0 &&
      (this->finished_samples).
      super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->finished_samples).
      super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
                *)&this->finished_samples,&this->current_sample);
  }
  else {
    dVar10 = round(this->sample_percentage * dVar10);
    allocator = this->allocator;
    this_00 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
              ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
    uVar4 = RandomEngine::NextRandomInteger((RandomEngine *)this_00);
    _Var5._M_head_impl = (ReservoirSample *)operator_new(0x58);
    ReservoirSample::ReservoirSample
              (_Var5._M_head_impl,allocator,
               (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10,
               (ulong)uVar4);
    local_38.super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ReservoirSample_*,_false>)
         (_Head_base<0UL,_duckdb::ReservoirSample_*,_false>)_Var5._M_head_impl;
    do {
      pRVar6 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->(&this->current_sample);
      (*(pRVar6->super_BlockingSample)._vptr_BlockingSample[6])(&local_40,pRVar6);
      if (local_40._M_head_impl == (DataChunk *)0x0) {
LAB_01722b17:
        bVar2 = false;
      }
      else {
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_40);
        if (pDVar7->count == 0) goto LAB_01722b17;
        pRVar6 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                 ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                               *)&local_38);
        pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_40);
        bVar2 = true;
        (*(pRVar6->super_BlockingSample)._vptr_BlockingSample[2])(pRVar6,pDVar8);
      }
      _Var3._M_head_impl = local_40._M_head_impl;
      if (local_40._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk(local_40._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
    } while (bVar2);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
                *)&this->finished_samples,
               (unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                *)&local_38);
    if (local_38.super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl !=
        (ReservoirSample *)0x0) {
      (**(code **)(*(long *)local_38.super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  _Var5._M_head_impl =
       (this->current_sample).
       super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = (ReservoirSample *)0x0;
  if (_Var5._M_head_impl != (ReservoirSample *)0x0) {
    (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BlockingSample + 8))();
  }
  this->is_finalized = true;
  return;
}

Assistant:

void ReservoirSamplePercentage::Finalize() {
	// need to finalize the current sample, if any
	// we are finializing, so we are starting to return chunks. Our last chunk has
	// sample_percentage * RESERVOIR_THRESHOLD entries that hold samples.
	// if our current count is less than the sample_percentage * RESERVOIR_THRESHOLD
	// then we have sampled too much for the current_sample and we need to redo the sample
	// otherwise we can just push the current sample back
	// Imagine sampling 70% of 100 rows (so 70 rows). We allocate sample_percentage * RESERVOIR_THRESHOLD
	// -----------------------------------------
	auto sampled_more_than_required =
	    static_cast<double>(current_count) > sample_percentage * RESERVOIR_THRESHOLD || finished_samples.empty();
	if (current_count > 0 && sampled_more_than_required) {
		// create a new sample
		auto new_sample_size = static_cast<idx_t>(round(sample_percentage * static_cast<double>(current_count)));
		auto new_sample = make_uniq<ReservoirSample>(allocator, new_sample_size, base_reservoir_sample->random());
		while (true) {
			auto chunk = current_sample->GetChunk();
			if (!chunk || chunk->size() == 0) {
				break;
			}
			new_sample->AddToReservoir(*chunk);
		}
		finished_samples.push_back(std::move(new_sample));
	} else {
		finished_samples.push_back(std::move(current_sample));
	}
	// when finalizing, current_sample is null. All samples are now in finished samples.
	current_sample = nullptr;
	is_finalized = true;
}